

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O2

void TTD::NSSnapObjects::ParseAddtlInfo_SnapMapInfo
               (SnapObject *snpObject,FileReader *reader,SlabAllocator *alloc)

{
  uint32 uVar1;
  SnapMapInfo *addtlInfo;
  void **ppvVar2;
  TTDVar pvVar3;
  uint32 i;
  uint uVar4;
  
  addtlInfo = (SnapMapInfo *)SlabAllocatorBase<0>::SlabAllocateTypeRawSize<16ul>(alloc);
  uVar1 = FileReader::ReadLengthValue(reader,true);
  addtlInfo->MapSize = uVar1;
  if (uVar1 == 0) {
    addtlInfo->MapKeyValueArray = (TTDVar *)0x0;
  }
  else {
    ppvVar2 = SlabAllocatorBase<0>::SlabAllocateArray<void*>(alloc,(ulong)uVar1);
    addtlInfo->MapKeyValueArray = ppvVar2;
    FileReader::ReadSequenceStart_WDefaultKey(reader,true);
    for (uVar4 = 0; uVar4 < addtlInfo->MapSize; uVar4 = uVar4 + 2) {
      (*reader->_vptr_FileReader[4])(reader,(ulong)(uVar4 != 0));
      pvVar3 = NSSnapValues::ParseTTDVar(false,reader);
      addtlInfo->MapKeyValueArray[uVar4] = pvVar3;
      pvVar3 = NSSnapValues::ParseTTDVar(true,reader);
      addtlInfo->MapKeyValueArray[uVar4 + 1] = pvVar3;
      (*reader->_vptr_FileReader[5])(reader);
    }
    (*reader->_vptr_FileReader[5])(reader);
  }
  SnapObjectSetAddtlInfoAs<TTD::NSSnapObjects::SnapMapInfo*,(TTD::NSSnapObjects::SnapObjectType)26>
            (snpObject,addtlInfo);
  return;
}

Assistant:

void ParseAddtlInfo_SnapMapInfo(SnapObject* snpObject, FileReader* reader, SlabAllocator& alloc)
        {
            SnapMapInfo* mapInfo = alloc.SlabAllocateStruct<SnapMapInfo>();

            mapInfo->MapSize = reader->ReadLengthValue(true);
            if(mapInfo->MapSize == 0)
            {
                mapInfo->MapKeyValueArray = nullptr;
            }
            else
            {
                mapInfo->MapKeyValueArray = alloc.SlabAllocateArray<TTDVar>(mapInfo->MapSize);

                reader->ReadSequenceStart_WDefaultKey(true);
                for(uint32 i = 0; i < mapInfo->MapSize; i += 2)
                {
                    reader->ReadSequenceStart(i != 0);
                    mapInfo->MapKeyValueArray[i] = NSSnapValues::ParseTTDVar(false, reader);
                    mapInfo->MapKeyValueArray[i + 1] = NSSnapValues::ParseTTDVar(true, reader);
                    reader->ReadSequenceEnd();
                }
                reader->ReadSequenceEnd();
            }

            SnapObjectSetAddtlInfoAs<SnapMapInfo*, SnapObjectType::SnapMapObject>(snpObject, mapInfo);
        }